

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
::occluded(BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Collider CVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar49;
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 auVar48 [16];
  float fVar51;
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar64;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  float fVar74;
  float fVar75;
  undefined1 auVar71 [16];
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  RayQueryContext *local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  Ray *local_a70;
  undefined8 local_a68;
  float fStack_a60;
  float fStack_a5c;
  undefined8 local_a58;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  undefined1 local_a28 [16];
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  undefined8 local_9e8;
  float fStack_9e0;
  float fStack_9dc;
  undefined8 local_9d8;
  float fStack_9d0;
  float fStack_9cc;
  long local_9c0;
  undefined4 local_9b8;
  float local_9b4;
  float local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  uint local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  int *local_988;
  undefined8 local_980;
  undefined4 *local_978;
  Intersectors *local_970;
  undefined4 *local_968;
  undefined4 local_960;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8e8 [16];
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [16];
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  ulong local_7d8 [245];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar77 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar77)) {
    local_a70 = ray;
    puVar28 = local_7d8 + 1;
    local_7d8[0] = *(ulong *)(*(long *)this + 0x70);
    fVar112 = *(float *)&This->ptr;
    fVar108 = *(float *)((long)&This->ptr + 4);
    fVar46 = *(float *)&This->leafIntersector;
    fVar96 = *(float *)((long)&This->leafIntersector + 4);
    CVar19 = This->collider;
    uVar33 = -(uint)(1e-18 <= ABS(CVar19.collide._0_4_));
    uVar34 = -(uint)(1e-18 <= ABS(CVar19.collide._4_4_));
    uVar37 = -(uint)(1e-18 <= ABS(CVar19.name._0_4_));
    uVar41 = -(uint)(1e-18 <= ABS(CVar19.name._4_4_));
    auVar58 = divps(_DAT_01f46a60,(undefined1  [16])CVar19);
    auVar54._0_4_ = auVar58._0_4_ & uVar33;
    auVar54._4_4_ = auVar58._4_4_ & uVar34;
    auVar54._8_4_ = auVar58._8_4_ & uVar37;
    auVar54._12_4_ = auVar58._12_4_ & uVar41;
    auVar58._0_8_ = CONCAT44(~uVar34,~uVar33) & 0x5d5e0b6b5d5e0b6b;
    auVar58._8_4_ = ~uVar37 & 0x5d5e0b6b;
    auVar58._12_4_ = ~uVar41 & 0x5d5e0b6b;
    fVar82 = 0.0;
    if (0.0 <= fVar96) {
      fVar82 = fVar96;
    }
    auVar58 = auVar58 | auVar54;
    fVar90 = auVar58._0_4_ * 0.99999964;
    fVar93 = auVar58._4_4_ * 0.99999964;
    fVar96 = auVar58._8_4_ * 0.99999964;
    fVar87 = auVar58._0_4_ * 1.0000004;
    fVar88 = auVar58._4_4_ * 1.0000004;
    fVar89 = auVar58._8_4_ * 1.0000004;
    uVar29 = (ulong)(fVar90 < 0.0) << 4;
    uVar30 = (ulong)(fVar93 < 0.0) << 4 | 0x20;
    uVar26 = (ulong)(fVar96 < 0.0) << 4 | 0x40;
    uVar31 = uVar29 ^ 0x10;
    auVar84._4_4_ = fVar82;
    auVar84._0_4_ = fVar82;
    auVar84._8_4_ = fVar82;
    auVar84._12_4_ = fVar82;
    auVar71._4_4_ = fVar77;
    auVar71._0_4_ = fVar77;
    auVar71._8_4_ = fVar77;
    auVar71._12_4_ = fVar77;
    _local_898 = mm_lookupmask_ps._240_8_;
    _uStack_890 = mm_lookupmask_ps._248_8_;
    local_8c8 = auVar71;
    local_8d8 = fVar46;
    fStack_8d4 = fVar46;
    fStack_8d0 = fVar46;
    fStack_8cc = fVar46;
    local_8e8 = auVar84;
    local_8f8 = fVar89;
    fStack_8f4 = fVar89;
    fStack_8f0 = fVar89;
    fStack_8ec = fVar89;
    local_908 = fVar96;
    fStack_904 = fVar96;
    fStack_900 = fVar96;
    fStack_8fc = fVar96;
    local_918 = fVar112;
    fStack_914 = fVar112;
    fStack_910 = fVar112;
    fStack_90c = fVar112;
    local_928 = fVar108;
    fStack_924 = fVar108;
    fStack_920 = fVar108;
    fStack_91c = fVar108;
    local_938 = fVar90;
    fStack_934 = fVar90;
    fStack_930 = fVar90;
    fStack_92c = fVar90;
    local_948 = fVar93;
    fStack_944 = fVar93;
    fStack_940 = fVar93;
    fStack_93c = fVar93;
    local_958 = fVar87;
    fStack_954 = fVar87;
    fStack_950 = fVar87;
    fStack_94c = fVar87;
    local_aa8 = context;
    fVar77 = fVar96;
    fVar82 = fVar96;
    fVar49 = fVar96;
    fVar50 = fVar112;
    fVar51 = fVar112;
    fVar56 = fVar112;
    fVar57 = fVar90;
    fVar64 = fVar90;
    fVar65 = fVar90;
    fVar66 = fVar93;
    fVar69 = fVar93;
    fVar70 = fVar93;
    fVar74 = fVar87;
    fVar75 = fVar87;
    fVar76 = fVar87;
    fVar119 = fVar88;
    fVar120 = fVar88;
    fVar121 = fVar88;
    fVar78 = fVar46;
    fVar80 = fVar46;
    fVar81 = fVar46;
    fVar83 = fVar89;
    fVar85 = fVar89;
    fVar86 = fVar89;
    fVar91 = fVar108;
    fVar92 = fVar108;
    fVar94 = fVar108;
LAB_00576ebe:
    if (puVar28 != local_7d8) {
      uVar32 = puVar28[-1];
      puVar28 = puVar28 + -1;
      do {
        fVar95 = *(float *)((long)&(This->collider).name + 4);
        do {
          if ((uVar32 & 8) != 0) {
            uVar25 = uVar32 & 0xfffffffffffffff0;
            local_9c0 = 0;
            lVar27 = (ulong)((uint)uVar32 & 0xf) - 8;
            goto LAB_0057704f;
          }
          uVar25 = uVar32 & 0xfffffffffffffff0;
          pfVar8 = (float *)(uVar25 + 0x80 + uVar29);
          pfVar1 = (float *)(uVar25 + 0x20 + uVar29);
          auVar52._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar112) * fVar90;
          auVar52._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar50) * fVar57;
          auVar52._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar51) * fVar64;
          auVar52._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar56) * fVar65;
          auVar58 = maxps(auVar84,auVar52);
          pfVar8 = (float *)(uVar25 + 0x80 + uVar30);
          pfVar1 = (float *)(uVar25 + 0x20 + uVar30);
          auVar53._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar108) * fVar93;
          auVar53._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar91) * fVar66;
          auVar53._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar92) * fVar69;
          auVar53._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar94) * fVar70;
          pfVar8 = (float *)(uVar25 + 0x80 + uVar26);
          pfVar1 = (float *)(uVar25 + 0x20 + uVar26);
          auVar59._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar46) * fVar96;
          auVar59._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar78) * fVar77;
          auVar59._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar80) * fVar82;
          auVar59._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar81) * fVar49;
          auVar54 = maxps(auVar53,auVar59);
          auVar58 = maxps(auVar58,auVar54);
          pfVar8 = (float *)(uVar25 + 0x80 + uVar31);
          pfVar1 = (float *)(uVar25 + 0x20 + uVar31);
          auVar60._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar112) * fVar87;
          auVar60._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar50) * fVar74;
          auVar60._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar51) * fVar75;
          auVar60._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar56) * fVar76;
          auVar54 = minps(auVar71,auVar60);
          pfVar8 = (float *)(uVar25 + 0x80 + (uVar30 ^ 0x10));
          pfVar1 = (float *)(uVar25 + 0x20 + (uVar30 ^ 0x10));
          auVar61._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar108) * fVar88;
          auVar61._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar91) * fVar119;
          auVar61._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar92) * fVar120;
          auVar61._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar94) * fVar121;
          pfVar8 = (float *)(uVar25 + 0x80 + (uVar26 ^ 0x10));
          pfVar1 = (float *)(uVar25 + 0x20 + (uVar26 ^ 0x10));
          auVar67._0_4_ = ((*pfVar8 * fVar95 + *pfVar1) - fVar46) * fVar89;
          auVar67._4_4_ = ((pfVar8[1] * fVar95 + pfVar1[1]) - fVar78) * fVar83;
          auVar67._8_4_ = ((pfVar8[2] * fVar95 + pfVar1[2]) - fVar80) * fVar85;
          auVar67._12_4_ = ((pfVar8[3] * fVar95 + pfVar1[3]) - fVar81) * fVar86;
          auVar62 = minps(auVar61,auVar67);
          auVar54 = minps(auVar54,auVar62);
          bVar20 = auVar58._0_4_ <= auVar54._0_4_;
          bVar21 = auVar58._4_4_ <= auVar54._4_4_;
          bVar22 = auVar58._8_4_ <= auVar54._8_4_;
          bVar23 = auVar58._12_4_ <= auVar54._12_4_;
          if (((uint)uVar32 & 7) == 6) {
            bVar20 = (fVar95 < *(float *)(uVar25 + 0xf0) && *(float *)(uVar25 + 0xe0) <= fVar95) &&
                     bVar20;
            bVar21 = (fVar95 < *(float *)(uVar25 + 0xf4) && *(float *)(uVar25 + 0xe4) <= fVar95) &&
                     bVar21;
            bVar22 = (fVar95 < *(float *)(uVar25 + 0xf8) && *(float *)(uVar25 + 0xe8) <= fVar95) &&
                     bVar22;
            bVar23 = (fVar95 < *(float *)(uVar25 + 0xfc) && *(float *)(uVar25 + 0xec) <= fVar95) &&
                     bVar23;
          }
          auVar47._0_4_ = (uint)bVar20 * -0x80000000;
          auVar47._4_4_ = (uint)bVar21 * -0x80000000;
          auVar47._8_4_ = (uint)bVar22 * -0x80000000;
          auVar47._12_4_ = (uint)bVar23 * -0x80000000;
          uVar33 = movmskps((int)local_aa8,auVar47);
          local_aa8 = (RayQueryContext *)(ulong)uVar33;
          if (uVar33 == 0) goto LAB_00576ebe;
          lVar27 = 0;
          if ((byte)uVar33 != 0) {
            for (; ((byte)uVar33 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          uVar32 = *(ulong *)(uVar25 + lVar27 * 8);
          uVar33 = (uVar33 & 0xff) - 1 & uVar33 & 0xff;
          local_aa8 = (RayQueryContext *)(ulong)uVar33;
        } while (uVar33 == 0);
        do {
          *puVar28 = uVar32;
          puVar28 = puVar28 + 1;
          lVar27 = 0;
          if (local_aa8 != (RayQueryContext *)0x0) {
            for (; ((ulong)local_aa8 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          uVar32 = *(ulong *)(uVar25 + lVar27 * 8);
          local_aa8 = (RayQueryContext *)((ulong)((long)&local_aa8[-1].args + 7) & (ulong)local_aa8)
          ;
        } while (local_aa8 != (RayQueryContext *)0x0);
      } while( true );
    }
  }
  return;
LAB_0057704f:
  if (local_9c0 == lVar27) goto LAB_00576ebe;
  local_aa8 = (RayQueryContext *)(local_9c0 * 0x140);
  fVar77 = *(float *)((long)&(This->collider).name + 4);
  pfVar9 = (float *)((long)&local_aa8[6].scene + uVar25);
  pfVar1 = (float *)((long)&local_aa8->scene + uVar25);
  pfVar10 = (float *)((long)&local_aa8[6].args + uVar25);
  pfVar8 = (float *)((long)&local_aa8->args + uVar25);
  pfVar11 = (float *)((long)&local_aa8[7].user + uVar25);
  pfVar2 = (float *)((long)&local_aa8[1].user + uVar25);
  pfVar12 = (float *)((long)&local_aa8[8].scene + uVar25);
  pfVar3 = (float *)((long)&local_aa8[2].scene + uVar25);
  pfVar13 = (float *)((long)&local_aa8[8].args + uVar25);
  pfVar4 = (float *)((long)&local_aa8[2].args + uVar25);
  pfVar14 = (float *)((long)&local_aa8[9].user + uVar25);
  pfVar5 = (float *)((long)&local_aa8[3].user + uVar25);
  pfVar15 = (float *)((long)&local_aa8[10].scene + uVar25);
  pfVar6 = (float *)((long)&local_aa8[4].scene + uVar25);
  pfVar16 = (float *)((long)&local_aa8[10].args + uVar25);
  pfVar7 = (float *)((long)&local_aa8[4].args + uVar25);
  pfVar17 = (float *)((long)&local_aa8[0xb].user + uVar25);
  pfVar18 = (float *)((long)&local_aa8[5].user + uVar25);
  fVar82 = *(float *)&This->ptr;
  fVar112 = *(float *)((long)&This->ptr + 4);
  fVar108 = *(float *)&This->leafIntersector;
  fVar99 = (*pfVar9 * fVar77 + *pfVar1) - fVar82;
  fVar101 = (pfVar9[1] * fVar77 + pfVar1[1]) - fVar82;
  fStack_9d0 = (pfVar9[2] * fVar77 + pfVar1[2]) - fVar82;
  fStack_9cc = (pfVar9[3] * fVar77 + pfVar1[3]) - fVar82;
  fVar117 = (*pfVar10 * fVar77 + *pfVar8) - fVar112;
  fVar118 = (pfVar10[1] * fVar77 + pfVar8[1]) - fVar112;
  fStack_a50 = (pfVar10[2] * fVar77 + pfVar8[2]) - fVar112;
  fStack_a4c = (pfVar10[3] * fVar77 + pfVar8[3]) - fVar112;
  fVar51 = (*pfVar11 * fVar77 + *pfVar2) - fVar108;
  fVar56 = (pfVar11[1] * fVar77 + pfVar2[1]) - fVar108;
  fStack_a60 = (pfVar11[2] * fVar77 + pfVar2[2]) - fVar108;
  fStack_a5c = (pfVar11[3] * fVar77 + pfVar2[3]) - fVar108;
  local_a48 = (*pfVar12 * fVar77 + *pfVar3) - fVar82;
  fStack_a44 = (pfVar12[1] * fVar77 + pfVar3[1]) - fVar82;
  fStack_a40 = (pfVar12[2] * fVar77 + pfVar3[2]) - fVar82;
  fStack_a3c = (pfVar12[3] * fVar77 + pfVar3[3]) - fVar82;
  fVar69 = (*pfVar13 * fVar77 + *pfVar4) - fVar112;
  fVar87 = (pfVar13[1] * fVar77 + pfVar4[1]) - fVar112;
  fVar75 = (pfVar13[2] * fVar77 + pfVar4[2]) - fVar112;
  fVar76 = (pfVar13[3] * fVar77 + pfVar4[3]) - fVar112;
  fVar83 = (*pfVar14 * fVar77 + *pfVar5) - fVar108;
  fVar85 = (pfVar14[1] * fVar77 + pfVar5[1]) - fVar108;
  fVar86 = (pfVar14[2] * fVar77 + pfVar5[2]) - fVar108;
  fVar89 = (pfVar14[3] * fVar77 + pfVar5[3]) - fVar108;
  fVar78 = (*pfVar15 * fVar77 + *pfVar6) - fVar82;
  fVar80 = (pfVar15[1] * fVar77 + pfVar6[1]) - fVar82;
  fVar81 = (pfVar15[2] * fVar77 + pfVar6[2]) - fVar82;
  fVar82 = (pfVar15[3] * fVar77 + pfVar6[3]) - fVar82;
  fVar109 = (*pfVar16 * fVar77 + *pfVar7) - fVar112;
  fVar110 = (pfVar16[1] * fVar77 + pfVar7[1]) - fVar112;
  fVar111 = (pfVar16[2] * fVar77 + pfVar7[2]) - fVar112;
  fVar112 = (pfVar16[3] * fVar77 + pfVar7[3]) - fVar112;
  fVar105 = (fVar77 * *pfVar17 + *pfVar18) - fVar108;
  fVar106 = (fVar77 * pfVar17[1] + pfVar18[1]) - fVar108;
  fVar107 = (fVar77 * pfVar17[2] + pfVar18[2]) - fVar108;
  fVar108 = (fVar77 * pfVar17[3] + pfVar18[3]) - fVar108;
  fVar90 = fVar78 - fVar99;
  fVar64 = fVar80 - fVar101;
  fStack_9e0 = fVar81 - fStack_9d0;
  fStack_9dc = fVar82 - fStack_9cc;
  fVar70 = fVar109 - fVar117;
  fVar74 = fVar110 - fVar118;
  fStack_a00 = fVar111 - fStack_a50;
  fStack_9fc = fVar112 - fStack_a4c;
  fVar91 = fVar105 - fVar51;
  fVar94 = fVar106 - fVar56;
  fStack_9f0 = fVar107 - fStack_a60;
  fStack_9ec = fVar108 - fStack_a5c;
  local_9f8 = CONCAT44(fVar94,fVar91);
  local_a08 = CONCAT44(fVar74,fVar70);
  local_9e8 = (ulong *)CONCAT44(fVar64,fVar90);
  fVar77 = *(float *)&(This->collider).collide;
  fStack_a30 = *(float *)((long)&(This->collider).collide + 4);
  fStack_aa0 = *(float *)&(This->collider).name;
  local_a38 = CONCAT44(fStack_a30,fStack_a30);
  fStack_a2c = fStack_a30;
  local_a88 = (fVar70 * (fVar105 + fVar51) - fVar91 * (fVar109 + fVar117)) * fVar77 +
              (fVar91 * (fVar78 + fVar99) - (fVar105 + fVar51) * fVar90) * fStack_a30 +
              ((fVar109 + fVar117) * fVar90 - (fVar78 + fVar99) * fVar70) * fStack_aa0;
  fStack_a84 = (fVar74 * (fVar106 + fVar56) - fVar94 * (fVar110 + fVar118)) * fVar77 +
               (fVar94 * (fVar80 + fVar101) - (fVar106 + fVar56) * fVar64) * fStack_a30 +
               ((fVar110 + fVar118) * fVar64 - (fVar80 + fVar101) * fVar74) * fStack_aa0;
  fStack_a80 = (fStack_a00 * (fVar107 + fStack_a60) - fStack_9f0 * (fVar111 + fStack_a50)) * fVar77
               + (fStack_9f0 * (fVar81 + fStack_9d0) - (fVar107 + fStack_a60) * fStack_9e0) *
                 fStack_a30 +
                 ((fVar111 + fStack_a50) * fStack_9e0 - (fVar81 + fStack_9d0) * fStack_a00) *
                 fStack_aa0;
  fStack_a7c = (fStack_9fc * (fVar108 + fStack_a5c) - fStack_9ec * (fVar112 + fStack_a4c)) * fVar77
               + (fStack_9ec * (fVar82 + fStack_9cc) - (fVar108 + fStack_a5c) * fStack_9dc) *
                 fStack_a30 +
                 ((fVar112 + fStack_a4c) * fStack_9dc - (fVar82 + fStack_9cc) * fStack_9fc) *
                 fStack_aa0;
  fVar57 = fVar117 - fVar69;
  fVar65 = fVar118 - fVar87;
  fVar93 = fStack_a50 - fVar75;
  fVar66 = fStack_a4c - fVar76;
  local_a18 = fVar51 - fVar83;
  fStack_a14 = fVar56 - fVar85;
  fStack_a10 = fStack_a60 - fVar86;
  fStack_a0c = fStack_a5c - fVar89;
  local_a58 = (byte *)CONCAT44(fVar118,fVar117);
  local_a68 = (Intersectors *)CONCAT44(fVar56,fVar51);
  fVar113 = fVar99 - local_a48;
  fVar114 = fVar101 - fStack_a44;
  fVar115 = fStack_9d0 - fStack_a40;
  fVar116 = fStack_9cc - fStack_a3c;
  local_9d8 = CONCAT44(fVar101,fVar99);
  local_a28._0_4_ =
       (fVar57 * (fVar51 + fVar83) - local_a18 * (fVar117 + fVar69)) * fVar77 +
       (local_a18 * (fVar99 + local_a48) - (fVar51 + fVar83) * fVar113) * fStack_a30 +
       ((fVar117 + fVar69) * fVar113 - (fVar99 + local_a48) * fVar57) * fStack_aa0;
  local_a28._4_4_ =
       (fVar65 * (fVar56 + fVar85) - fStack_a14 * (fVar118 + fVar87)) * fVar77 +
       (fStack_a14 * (fVar101 + fStack_a44) - (fVar56 + fVar85) * fVar114) * fStack_a30 +
       ((fVar118 + fVar87) * fVar114 - (fVar101 + fStack_a44) * fVar65) * fStack_aa0;
  local_a28._8_4_ =
       (fVar93 * (fStack_a60 + fVar86) - fStack_a10 * (fStack_a50 + fVar75)) * fVar77 +
       (fStack_a10 * (fStack_9d0 + fStack_a40) - (fStack_a60 + fVar86) * fVar115) * fStack_a30 +
       ((fStack_a50 + fVar75) * fVar115 - (fStack_9d0 + fStack_a40) * fVar93) * fStack_aa0;
  local_a28._12_4_ =
       (fVar66 * (fStack_a5c + fVar89) - fStack_a0c * (fStack_a4c + fVar76)) * fVar77 +
       (fStack_a0c * (fStack_9cc + fStack_a3c) - (fStack_a5c + fVar89) * fVar116) * fStack_a30 +
       ((fStack_a4c + fVar76) * fVar116 - (fStack_9cc + fStack_a3c) * fVar66) * fStack_aa0;
  fVar92 = local_a48 - fVar78;
  fVar95 = fStack_a44 - fVar80;
  fVar97 = fStack_a40 - fVar81;
  fVar98 = fStack_a3c - fVar82;
  fVar46 = fVar69 - fVar109;
  fVar96 = fVar87 - fVar110;
  fVar49 = fVar75 - fVar111;
  fVar50 = fVar76 - fVar112;
  fVar100 = fVar83 - fVar105;
  fVar102 = fVar85 - fVar106;
  fVar103 = fVar86 - fVar107;
  fVar104 = fVar89 - fVar108;
  auVar55._0_4_ =
       (fVar46 * (fVar105 + fVar83) - fVar100 * (fVar109 + fVar69)) * fVar77 +
       (fVar100 * (fVar78 + local_a48) - (fVar105 + fVar83) * fVar92) * fStack_a30 +
       ((fVar109 + fVar69) * fVar92 - (fVar78 + local_a48) * fVar46) * fStack_aa0;
  auVar55._4_4_ =
       (fVar96 * (fVar106 + fVar85) - fVar102 * (fVar110 + fVar87)) * fVar77 +
       (fVar102 * (fVar80 + fStack_a44) - (fVar106 + fVar85) * fVar95) * fStack_a30 +
       ((fVar110 + fVar87) * fVar95 - (fVar80 + fStack_a44) * fVar96) * fStack_aa0;
  auVar55._8_4_ =
       (fVar49 * (fVar107 + fVar86) - fVar103 * (fVar111 + fVar75)) * fVar77 +
       (fVar103 * (fVar81 + fStack_a40) - (fVar107 + fVar86) * fVar97) * fStack_a30 +
       ((fVar111 + fVar75) * fVar97 - (fVar81 + fStack_a40) * fVar49) * fStack_aa0;
  auVar55._12_4_ =
       (fVar50 * (fVar108 + fVar89) - fVar104 * (fVar112 + fVar76)) * fVar77 +
       (fVar104 * (fVar82 + fStack_a3c) - (fVar108 + fVar89) * fVar98) * fStack_a30 +
       ((fVar112 + fVar76) * fVar98 - (fVar82 + fStack_a3c) * fVar50) * fStack_aa0;
  auVar62._4_4_ = fStack_a84;
  auVar62._0_4_ = local_a88;
  auVar62._8_4_ = fStack_a80;
  auVar62._12_4_ = fStack_a7c;
  local_8a8 = local_a88 + local_a28._0_4_ + auVar55._0_4_;
  fStack_8a4 = fStack_a84 + local_a28._4_4_ + auVar55._4_4_;
  fStack_8a0 = fStack_a80 + local_a28._8_4_ + auVar55._8_4_;
  fStack_89c = fStack_a7c + local_a28._12_4_ + auVar55._12_4_;
  auVar58 = minps(auVar62,local_a28);
  auVar54 = minps(auVar58,auVar55);
  auVar58 = maxps(auVar62,local_a28);
  auVar58 = maxps(auVar58,auVar55);
  local_8b8 = ABS(local_8a8);
  fStack_8b4 = ABS(fStack_8a4);
  fStack_8b0 = ABS(fStack_8a0);
  fStack_8ac = ABS(fStack_89c);
  auVar79._0_4_ =
       -(uint)(auVar58._0_4_ <= local_8b8 * 1.1920929e-07 ||
              -(local_8b8 * 1.1920929e-07) <= auVar54._0_4_) & local_898;
  auVar79._4_4_ =
       -(uint)(auVar58._4_4_ <= fStack_8b4 * 1.1920929e-07 ||
              -(fStack_8b4 * 1.1920929e-07) <= auVar54._4_4_) & uStack_894;
  auVar79._8_4_ =
       -(uint)(auVar58._8_4_ <= fStack_8b0 * 1.1920929e-07 ||
              -(fStack_8b0 * 1.1920929e-07) <= auVar54._8_4_) & uStack_890;
  auVar79._12_4_ =
       -(uint)(auVar58._12_4_ <= fStack_8ac * 1.1920929e-07 ||
              -(fStack_8ac * 1.1920929e-07) <= auVar54._12_4_) & uStack_88c;
  iVar24 = movmskps((int)local_9c0,auVar79);
  local_a68 = This;
  local_a08 = lVar27;
  local_9e8 = puVar28;
  local_9f8 = uVar29;
  if (iVar24 != 0) {
    local_a48 = fVar88;
    fStack_a44 = fVar119;
    fStack_a40 = fVar120;
    fStack_a3c = fVar121;
    uVar33 = -(uint)(ABS(local_a18 * fVar46) <= ABS(fVar91 * fVar57));
    uVar41 = -(uint)(ABS(fStack_a14 * fVar96) <= ABS(fVar94 * fVar65));
    uVar38 = -(uint)(ABS(fStack_a10 * fVar49) <= ABS(fStack_9f0 * fVar93));
    uVar42 = -(uint)(ABS(fStack_a0c * fVar50) <= ABS(fStack_9ec * fVar66));
    uVar34 = -(uint)(ABS(fVar113 * fVar100) <= ABS(fVar90 * local_a18));
    uVar35 = -(uint)(ABS(fVar114 * fVar102) <= ABS(fVar64 * fStack_a14));
    uVar39 = -(uint)(ABS(fVar115 * fVar103) <= ABS(fStack_9e0 * fStack_a10));
    uVar43 = -(uint)(ABS(fVar116 * fVar104) <= ABS(fStack_9dc * fStack_a0c));
    uVar37 = -(uint)(ABS(fVar57 * fVar92) <= ABS(fVar70 * fVar113));
    uVar36 = -(uint)(ABS(fVar65 * fVar95) <= ABS(fVar74 * fVar114));
    uVar40 = -(uint)(ABS(fVar93 * fVar97) <= ABS(fStack_a00 * fVar115));
    uVar44 = -(uint)(ABS(fVar66 * fVar98) <= ABS(fStack_9fc * fVar116));
    auVar63._0_4_ = (uint)(fVar57 * fVar100 - local_a18 * fVar46) & uVar33;
    auVar63._4_4_ = (uint)(fVar65 * fVar102 - fStack_a14 * fVar96) & uVar41;
    auVar63._8_4_ = (uint)(fVar93 * fVar103 - fStack_a10 * fVar49) & uVar38;
    auVar63._12_4_ = (uint)(fVar66 * fVar104 - fStack_a0c * fVar50) & uVar42;
    local_808._0_4_ = ~uVar33 & (uint)(fVar70 * local_a18 - fVar91 * fVar57);
    local_808._4_4_ = ~uVar41 & (uint)(fVar74 * fStack_a14 - fVar94 * fVar65);
    local_808._8_4_ = ~uVar38 & (uint)(fStack_a00 * fStack_a10 - fStack_9f0 * fVar93);
    local_808._12_4_ = ~uVar42 & (uint)(fStack_9fc * fStack_a0c - fStack_9ec * fVar66);
    local_808 = local_808 | auVar63;
    local_7f8[0] = (float)(~uVar34 & (uint)(fVar91 * fVar113 - fVar90 * local_a18) |
                          (uint)(local_a18 * fVar92 - fVar113 * fVar100) & uVar34);
    local_7f8[1] = (float)(~uVar35 & (uint)(fVar94 * fVar114 - fVar64 * fStack_a14) |
                          (uint)(fStack_a14 * fVar95 - fVar114 * fVar102) & uVar35);
    local_7f8[2] = (float)(~uVar39 & (uint)(fStack_9f0 * fVar115 - fStack_9e0 * fStack_a10) |
                          (uint)(fStack_a10 * fVar97 - fVar115 * fVar103) & uVar39);
    local_7f8[3] = (float)(~uVar43 & (uint)(fStack_9ec * fVar116 - fStack_9dc * fStack_a0c) |
                          (uint)(fStack_a0c * fVar98 - fVar116 * fVar104) & uVar43);
    local_7e8[0] = (float)(~uVar37 & (uint)(fVar90 * fVar57 - fVar70 * fVar113) |
                          (uint)(fVar113 * fVar46 - fVar57 * fVar92) & uVar37);
    local_7e8[1] = (float)(~uVar36 & (uint)(fVar64 * fVar65 - fVar74 * fVar114) |
                          (uint)(fVar114 * fVar96 - fVar65 * fVar95) & uVar36);
    local_7e8[2] = (float)(~uVar40 & (uint)(fStack_9e0 * fVar93 - fStack_a00 * fVar115) |
                          (uint)(fVar115 * fVar49 - fVar93 * fVar97) & uVar40);
    local_7e8[3] = (float)(~uVar44 & (uint)(fStack_9dc * fVar66 - fStack_9fc * fVar116) |
                          (uint)(fVar116 * fVar50 - fVar66 * fVar98) & uVar44);
    fVar82 = fVar77 * local_808._0_4_ + fStack_a30 * local_7f8[0] + fStack_aa0 * local_7e8[0];
    fVar112 = fVar77 * local_808._4_4_ + fStack_a30 * local_7f8[1] + fStack_aa0 * local_7e8[1];
    fVar108 = fVar77 * local_808._8_4_ + fStack_a30 * local_7f8[2] + fStack_aa0 * local_7e8[2];
    fVar77 = fVar77 * local_808._12_4_ + fStack_a30 * local_7f8[3] + fStack_aa0 * local_7e8[3];
    auVar72._0_4_ = fVar82 + fVar82;
    auVar72._4_4_ = fVar112 + fVar112;
    auVar72._8_4_ = fVar108 + fVar108;
    auVar72._12_4_ = fVar77 + fVar77;
    auVar48._0_4_ = fVar51 * local_7e8[0];
    auVar48._4_4_ = fVar56 * local_7e8[1];
    auVar48._8_4_ = fStack_a60 * local_7e8[2];
    auVar48._12_4_ = fStack_a5c * local_7e8[3];
    fVar46 = fVar99 * local_808._0_4_ + fVar117 * local_7f8[0] + auVar48._0_4_;
    fVar96 = fVar101 * local_808._4_4_ + fVar118 * local_7f8[1] + auVar48._4_4_;
    fVar49 = fStack_9d0 * local_808._8_4_ + fStack_a50 * local_7f8[2] + auVar48._8_4_;
    fVar50 = fStack_9cc * local_808._12_4_ + fStack_a4c * local_7f8[3] + auVar48._12_4_;
    auVar58 = rcpps(auVar48,auVar72);
    fVar77 = auVar58._0_4_;
    fVar82 = auVar58._4_4_;
    fVar112 = auVar58._8_4_;
    fVar108 = auVar58._12_4_;
    local_818._0_4_ =
         (((float)DAT_01f46a60 - auVar72._0_4_ * fVar77) * fVar77 + fVar77) * (fVar46 + fVar46);
    local_818._4_4_ =
         ((DAT_01f46a60._4_4_ - auVar72._4_4_ * fVar82) * fVar82 + fVar82) * (fVar96 + fVar96);
    local_818._8_4_ =
         ((DAT_01f46a60._8_4_ - auVar72._8_4_ * fVar112) * fVar112 + fVar112) * (fVar49 + fVar49);
    local_818._12_4_ =
         ((DAT_01f46a60._12_4_ - auVar72._12_4_ * fVar108) * fVar108 + fVar108) * (fVar50 + fVar50);
    fVar77 = *(float *)&(This->intersector1).intersect;
    fVar82 = *(float *)((long)&This->leafIntersector + 4);
    auVar73._0_4_ =
         (int)((uint)(auVar72._0_4_ != 0.0 &&
                     (local_818._0_4_ <= fVar77 && fVar82 <= local_818._0_4_)) * -0x80000000) >>
         0x1f;
    auVar73._4_4_ =
         (int)((uint)(auVar72._4_4_ != 0.0 &&
                     (local_818._4_4_ <= fVar77 && fVar82 <= local_818._4_4_)) * -0x80000000) >>
         0x1f;
    auVar73._8_4_ =
         (int)((uint)(auVar72._8_4_ != 0.0 &&
                     (local_818._8_4_ <= fVar77 && fVar82 <= local_818._8_4_)) * -0x80000000) >>
         0x1f;
    auVar73._12_4_ =
         (int)((uint)(auVar72._12_4_ != 0.0 &&
                     (local_818._12_4_ <= fVar77 && fVar82 <= local_818._12_4_)) * -0x80000000) >>
         0x1f;
    uVar33 = movmskps(iVar24,auVar73 & auVar79);
    if (uVar33 != 0) {
      local_aa8 = (RayQueryContext *)((long)&local_aa8->scene + uVar25);
      local_888 = local_a88;
      fStack_884 = fStack_a84;
      fStack_880 = fStack_a80;
      fStack_87c = fStack_a7c;
      local_878 = local_a28;
      local_868._4_4_ = fStack_8a4;
      local_868._0_4_ = local_8a8;
      local_868._8_4_ = fStack_8a0;
      local_868._12_4_ = fStack_89c;
      local_858 = &local_aa9;
      local_848 = auVar73 & auVar79;
      auVar58 = rcpps(local_818,local_868);
      fVar77 = auVar58._0_4_;
      fVar82 = auVar58._4_4_;
      fVar112 = auVar58._8_4_;
      fVar108 = auVar58._12_4_;
      fVar77 = (float)(-(uint)(1e-18 <= local_8b8) &
                      (uint)(((float)DAT_01f46a60 - local_8a8 * fVar77) * fVar77 + fVar77));
      fVar82 = (float)(-(uint)(1e-18 <= fStack_8b4) &
                      (uint)((DAT_01f46a60._4_4_ - fStack_8a4 * fVar82) * fVar82 + fVar82));
      fVar112 = (float)(-(uint)(1e-18 <= fStack_8b0) &
                       (uint)((DAT_01f46a60._8_4_ - fStack_8a0 * fVar112) * fVar112 + fVar112));
      fVar108 = (float)(-(uint)(1e-18 <= fStack_8ac) &
                       (uint)((DAT_01f46a60._12_4_ - fStack_89c * fVar108) * fVar108 + fVar108));
      auVar68._0_4_ = local_a88 * fVar77;
      auVar68._4_4_ = fStack_a84 * fVar82;
      auVar68._8_4_ = fStack_a80 * fVar112;
      auVar68._12_4_ = fStack_a7c * fVar108;
      local_838 = minps(auVar68,_DAT_01f46a60);
      auVar45._0_4_ = fVar77 * local_a28._0_4_;
      auVar45._4_4_ = fVar82 * local_a28._4_4_;
      auVar45._8_4_ = fVar112 * local_a28._8_4_;
      auVar45._12_4_ = fVar108 * local_a28._12_4_;
      local_828 = minps(auVar45,_DAT_01f46a60);
      local_9d8 = (ulong)(uVar33 & 0xff);
      local_a38 = *(long *)&(local_a70->org).field_0;
      fStack_a9c = fStack_aa0;
      do {
        uVar29 = 0;
        if (local_9d8 != 0) {
          for (; (local_9d8 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        local_9a0 = *(uint *)((long)&local_aa8[0xc].scene + uVar29 * 4);
        lVar27 = *(long *)(*(long *)(local_a38 + 0x1e8) + (ulong)local_9a0 * 8);
        if ((*(uint *)(lVar27 + 0x34) & *(uint *)((long)&(local_a68->intersector1).intersect + 4))
            == 0) {
          local_9d8 = local_9d8 ^ 1L << (uVar29 & 0x3f);
        }
        else {
          local_a88 = (float)uVar29;
          fStack_a84 = (float)(uVar29 >> 0x20);
          local_a58 = *(byte **)&(local_a70->dir).field_0;
          if ((*(long *)(local_a58 + 0x10) == 0) && (*(long *)(lVar27 + 0x48) == 0)) {
LAB_00577870:
            *(undefined4 *)&(local_a68->intersector1).intersect = 0xff800000;
            return;
          }
          local_978 = *(undefined4 **)((long)&(local_a70->org).field_0 + 8);
          local_9b8 = *(undefined4 *)(local_808 + uVar29 * 4);
          local_9b4 = local_7f8[uVar29];
          local_9b0 = local_7e8[uVar29];
          local_9ac = *(undefined4 *)(local_838 + uVar29 * 4);
          local_9a8 = *(undefined4 *)(local_828 + uVar29 * 4);
          local_9a4 = *(undefined4 *)((long)&local_aa8[0xc].args + uVar29 * 4);
          local_99c = *local_978;
          local_998 = local_978[1];
          local_a18 = (float)*(undefined4 *)&(local_a68->intersector1).intersect;
          *(undefined4 *)&(local_a68->intersector1).intersect =
               *(undefined4 *)(local_818 + uVar29 * 4);
          local_a8c = -1;
          local_988 = &local_a8c;
          local_980 = *(undefined8 *)(lVar27 + 0x18);
          local_968 = &local_9b8;
          local_960 = 1;
          local_a28._0_8_ = lVar27;
          local_970 = local_a68;
          if (((*(code **)(lVar27 + 0x48) == (code *)0x0) ||
              ((**(code **)(lVar27 + 0x48))(&local_988), *local_988 != 0)) &&
             ((*(code **)(local_a58 + 0x10) == (code *)0x0 ||
              ((((*local_a58 & 2) == 0 && ((*(byte *)(local_a28._0_8_ + 0x3e) & 0x40) == 0)) ||
               ((**(code **)(local_a58 + 0x10))(&local_988), *local_988 != 0))))))
          goto LAB_00577870;
          *(float *)&(local_a68->intersector1).intersect = local_a18;
          local_9d8 = local_9d8 ^ 1L << ((ulong)(uint)local_a88 & 0x3f);
          fVar88 = local_a48;
          fVar119 = fStack_a44;
          fVar120 = fStack_a40;
          fVar121 = fStack_a3c;
        }
      } while (local_9d8 != 0);
    }
  }
  local_9c0 = local_9c0 + 1;
  This = local_a68;
  lVar27 = local_a08;
  puVar28 = local_9e8;
  uVar29 = local_9f8;
  auVar71 = local_8c8;
  auVar84 = local_8e8;
  fVar96 = local_908;
  fVar77 = fStack_904;
  fVar82 = fStack_900;
  fVar49 = fStack_8fc;
  fVar112 = local_918;
  fVar50 = fStack_914;
  fVar51 = fStack_910;
  fVar56 = fStack_90c;
  fVar90 = local_938;
  fVar57 = fStack_934;
  fVar64 = fStack_930;
  fVar65 = fStack_92c;
  fVar93 = local_948;
  fVar66 = fStack_944;
  fVar69 = fStack_940;
  fVar70 = fStack_93c;
  fVar87 = local_958;
  fVar74 = fStack_954;
  fVar75 = fStack_950;
  fVar76 = fStack_94c;
  fVar46 = local_8d8;
  fVar78 = fStack_8d4;
  fVar80 = fStack_8d0;
  fVar81 = fStack_8cc;
  fVar89 = local_8f8;
  fVar83 = fStack_8f4;
  fVar85 = fStack_8f0;
  fVar86 = fStack_8ec;
  fVar108 = local_928;
  fVar91 = fStack_924;
  fVar92 = fStack_920;
  fVar94 = fStack_91c;
  goto LAB_0057704f;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }